

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O1

xmlChar * xmlEscapeText(xmlChar *text,int flags)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  xmlChar *__dest;
  xmlChar *pxVar5;
  size_t sVar6;
  byte *str;
  ulong uVar7;
  int iVar8;
  byte *pbVar9;
  long lVar10;
  int iVar11;
  size_t __n;
  int chunkSize;
  char buf [12];
  byte *local_80;
  int local_74;
  byte *local_70;
  xmlChar *local_68;
  uint local_5c;
  xmlChar *local_58;
  ulong local_50;
  size_t local_48;
  byte local_3c [12];
  
  __dest = (xmlChar *)(*xmlMalloc)(0x33);
  if (__dest == (xmlChar *)0x0) {
LAB_0012dda0:
    local_68 = (xmlChar *)0x0;
  }
  else {
    local_68 = __dest;
    if (*text != '\0') {
      local_5c = flags & 5;
      uVar7 = 0x32;
      pbVar9 = text;
LAB_0012d970:
      local_74 = 1;
      iVar11 = (int)pbVar9 + -1;
      iVar8 = (int)pbVar9 + -3;
      str = pbVar9;
      do {
        pbVar9 = str + 1;
        bVar2 = *str;
        if ((long)(char)bVar2 < 0) {
          if ((flags & 2U) != 0) goto LAB_0012d9b1;
        }
        else if (""[(char)bVar2] == '\0') goto LAB_0012d9b1;
        iVar11 = iVar11 + 1;
        iVar8 = iVar8 + 1;
        str = pbVar9;
      } while( true );
    }
LAB_0012dda7:
    *__dest = '\0';
  }
  return local_68;
LAB_0012d9b1:
  local_80 = str;
  if (bVar2 < 0x3c) {
    if (bVar2 == 0) {
      local_74 = 0;
LAB_0012da64:
      local_80 = (byte *)0x1e3623;
      sVar6 = 0;
    }
    else if (bVar2 == 0x26) {
      sVar6 = 5;
      if ((local_5c == 5) && (*pbVar9 == 0x7b)) {
        local_70 = text;
        pxVar5 = xmlStrchr(str,'}');
        if (pxVar5 == (xmlChar *)0x0) {
          local_80 = (byte *)0x1cd7fc;
          sVar6 = 5;
          text = local_70;
        }
        else {
          iVar11 = (int)pxVar5 - iVar11;
          local_74 = iVar11;
LAB_0012dd32:
          sVar6 = (size_t)iVar11;
          text = local_70;
        }
      }
      else {
        local_80 = (byte *)0x1cd7fc;
      }
    }
    else {
LAB_0012da39:
      if (((flags & 8U) == 0) || (sVar6 = 6, bVar2 != 0x22)) {
        if (((flags & 4U) == 0) && (sVar6 = 5, bVar2 == 0xd)) {
          local_80 = (byte *)0x1cd802;
        }
        else {
          if (((flags & 2U) != 0) && ((char)bVar2 < '\0')) {
            local_74 = 4;
            local_70 = text;
            iVar11 = xmlGetUTF8Char(str,&local_74);
            if (iVar11 < 0) {
              local_74 = 1;
LAB_0012dd13:
              iVar11 = 0xfffd;
            }
            else if ((flags & 0x10U) == 0) {
              if (iVar11 < 0x100) {
                if (iVar11 < 0x20) {
                  if (4 < iVar11 - 9U) goto LAB_0012dd13;
                  iVar11 = *(int *)(&DAT_001cd890 + (ulong)(iVar11 - 9U) * 4);
                }
              }
              else if ((0xfffff < iVar11 - 0x10000U && 0x1ffd < iVar11 - 0xe000U) && 0xd7ff < iVar11
                      ) goto LAB_0012dd13;
            }
            local_80 = local_3c;
            iVar11 = xmlSerializeHexCharRef((char *)local_80,iVar11);
            goto LAB_0012dd32;
          }
          if ((bVar2 != 0xd) &&
             ((((flags & 0x14U) == 0 && (bVar2 < 0x20)) && (1 < (byte)(bVar2 - 9)))))
          goto LAB_0012da64;
          bVar4 = false;
          if (*pbVar9 != 0) goto LAB_0012dc1e;
          local_74 = 0;
          local_80 = (byte *)0x1e3623;
          sVar6 = 0;
          str = pbVar9;
        }
      }
      else {
        local_80 = (byte *)0x1cd000;
      }
    }
  }
  else if (bVar2 == 0x3c) {
    sVar6 = 4;
    if ((((local_5c == 5) && (*pbVar9 == 0x21)) && (str[2] == 0x2d)) && (str[3] == 0x2d)) {
      local_70 = text;
      pxVar5 = xmlStrstr(str,"-->");
      text = local_70;
      if (pxVar5 == (xmlChar *)0x0) {
        local_80 = (byte *)0x1cd7f2;
        sVar6 = 4;
      }
      else {
        local_74 = (int)pxVar5 - iVar8;
        sVar6 = (size_t)local_74;
      }
    }
    else {
      local_80 = (byte *)0x1cd7f2;
    }
  }
  else {
    if (bVar2 != 0x3e) goto LAB_0012da39;
    sVar6 = 4;
    local_80 = (byte *)0x1cd7f7;
  }
  lVar10 = (long)__dest - (long)local_68;
  __n = (long)str - (long)text;
  uVar1 = __n + sVar6;
  pbVar9 = str + local_74;
  local_48 = sVar6;
  if (uVar7 - lVar10 < uVar1) {
    local_70 = text;
    local_58 = __dest;
    if (((long)uVar7 < 0) || ((uVar7 ^ 0x7fffffffffffffff) < uVar1)) {
      (*xmlFree)(local_68);
LAB_0012dbd4:
      bVar3 = false;
      __dest = local_58;
    }
    else {
      iVar11 = (int)uVar1 + (int)uVar7 << (*pbVar9 != 0);
      local_50 = uVar7;
      pxVar5 = (xmlChar *)(*xmlRealloc)(local_68,(long)(iVar11 + 1));
      if (pxVar5 == (xmlChar *)0x0) {
        (*xmlFree)(local_68);
        uVar7 = local_50;
        goto LAB_0012dbd4;
      }
      uVar7 = (ulong)iVar11;
      bVar3 = true;
      __dest = pxVar5 + lVar10;
      local_68 = pxVar5;
    }
    bVar4 = true;
    text = local_70;
    if (!bVar3) goto LAB_0012dc1e;
  }
  memcpy(__dest,text,__n);
  sVar6 = local_48;
  memcpy(__dest + __n,local_80,local_48);
  __dest = __dest + __n + sVar6;
  bVar4 = false;
  text = pbVar9;
LAB_0012dc1e:
  if (bVar4) goto LAB_0012dda0;
  if (*pbVar9 == 0) goto LAB_0012dda7;
  goto LAB_0012d970;
}

Assistant:

xmlChar *
xmlEscapeText(const xmlChar *text, int flags) {
    const xmlChar *cur;
    xmlChar *buffer;
    xmlChar *out;
    const xmlChar *unescaped;
    size_t size = 50;

    buffer = xmlMalloc(size + 1);
    if (buffer == NULL)
        return(NULL);
    out = buffer;

    cur = text;
    unescaped = cur;

    while (*cur != '\0') {
        char buf[12];
	const xmlChar *end;
        const xmlChar *repl;
        size_t used;
        size_t replSize;
        size_t unescapedSize;
        size_t totalSize;
        int chunkSize = 1;
        int c;

        /* accelerator */
	while (1) {
            c = *cur;

            if (c < 0x80) {
                if (!xmlEscapeSafe[*cur])
                    break;
            } else {
               if (flags & XML_ESCAPE_NON_ASCII)
                   break;
            }
            cur += 1;
        }

        if (c == 0) {
            chunkSize = 0;
            repl = BAD_CAST "";
            replSize = 0;
        } else if (c == '<') {
	    /*
	     * Special handling of server side include in HTML attributes
	     */
	    if ((flags & XML_ESCAPE_HTML) && (flags & XML_ESCAPE_ATTR) &&
	        (cur[1] == '!') && (cur[2] == '-') && (cur[3] == '-') &&
	        ((end = xmlStrstr(cur, BAD_CAST "-->")) != NULL)) {
                chunkSize = (end - cur) + 3;
                repl = cur;
                replSize = chunkSize;
	    } else {
                repl = BAD_CAST "&lt;";
                replSize = 4;
            }
	} else if (c == '>') {
            repl = BAD_CAST "&gt;";
            replSize = 4;
	} else if (c == '&') {
	    /*
	     * Special handling of &{...} construct from HTML 4, see
	     * http://www.w3.org/TR/html401/appendix/notes.html#h-B.7.1
	     */
	    if ((flags & XML_ESCAPE_HTML) && (flags & XML_ESCAPE_ATTR) &&
                (cur[1] == '{') && (end = xmlStrchr(cur, '}'))) {
                chunkSize = (end - cur) + 1;
                repl = cur;
                replSize = chunkSize;
	    } else {
                repl = BAD_CAST "&amp;";
                replSize = 5;
            }
	} else if ((flags & XML_ESCAPE_QUOT) && (c == '"')) {
            repl = BAD_CAST "&quot;";
            replSize = 6;
	} else if (((flags & XML_ESCAPE_HTML) == 0) && (c == '\r')) {
	    repl = BAD_CAST "&#13;";
            replSize = 5;
	} else if ((flags & XML_ESCAPE_NON_ASCII) && (c >= 0x80)) {
            int val;

            chunkSize = 4;
            val = xmlGetUTF8Char(cur, &chunkSize);
            if (val < 0) {
                val = 0xFFFD;
                chunkSize = 1;
            } else if (((flags & XML_ESCAPE_ALLOW_INVALID) == 0) &&
                       (!IS_CHAR(val))) {
                val = 0xFFFD;
            }

            replSize = xmlSerializeHexCharRef(buf, val);
            repl = BAD_CAST buf;
	} else if ((flags & (XML_ESCAPE_ALLOW_INVALID | XML_ESCAPE_HTML)) ||
                   (c >= 0x20) ||
	           (c == '\n') || (c == '\t') || (c == '\r')) {
	    /* default case, just copy */
            cur += 1;
            if (*cur != 0)
                continue;

            chunkSize = 0;
            repl = BAD_CAST "";
            replSize = 0;
	} else {
            /* ignore */
            repl = BAD_CAST "";
            replSize = 0;
        }

        used = out - buffer;
        unescapedSize = cur - unescaped;
        totalSize = unescapedSize + replSize;

	cur += chunkSize;

        if (totalSize > size - used) {
            xmlChar *tmp;
            int newSize;

            if ((size > (SIZE_MAX - 1) / 2) ||
                (totalSize > (SIZE_MAX - 1) / 2 - size)) {
                xmlFree(buffer);
                return(NULL);
            }
            newSize = size + totalSize;
            if (*cur != 0)
                newSize *= 2;
            tmp = xmlRealloc(buffer, newSize + 1);
            if (tmp == NULL) {
                xmlFree(buffer);
                return(NULL);
            }
            buffer = tmp;
            size = newSize;
            out = buffer + used;
        }

        memcpy(out, unescaped, unescapedSize);
        out += unescapedSize;
        memcpy(out, repl, replSize);
        out += replSize;

        unescaped = cur;
    }

    *out = 0;
    return(buffer);
}